

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *poVar1;
  void *this;
  TPZFMatrix<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_R8;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *in_stack_00000578;
  TPZFMatrix<double> *in_stack_00000580;
  int in_stack_0000058c;
  TPZVec<double> *in_stack_00000590;
  TPZFMatrix<double> *in_stack_00000858;
  TPZFMatrix<double> *in_stack_00000860;
  int in_stack_0000086c;
  TPZVec<double> *in_stack_00000870;
  TPZFMatrix<double> *in_stack_00000cc8;
  TPZFMatrix<double> *in_stack_00000cd0;
  int in_stack_00000cdc;
  TPZVec<double> *in_stack_00000ce0;
  
  if ((in_EDI < 5) || (0x12 < in_EDI)) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  switch(in_EDI) {
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    TPZShapeLinear::ShapeInternal(in_RSI,in_EDX,in_RCX,in_R8);
    break;
  case 0xd:
    TPZShapeQuad::ShapeInternal
              (in_stack_00000590,in_stack_0000058c,in_stack_00000580,in_stack_00000578);
    break;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    TPZShapeTriang::ShapeInternal
              (in_stack_00000ce0,in_stack_00000cdc,in_stack_00000cd0,in_stack_00000cc8);
    break;
  case 0x12:
    ShapeInternal(in_stack_00000870,in_stack_0000086c,in_stack_00000860,in_stack_00000858);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "static void pzshape::TPZShapePiram::ShapeInternal(int, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &)"
                            );
    poVar1 = std::operator<<(poVar1," Wrong side parameter side ");
    this = (void *)std::ostream::operator<<(poVar1,in_EDI);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 5 || side > 18) {
            DebugStop();
        }
        
        switch (side) {
                
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 11:
            case 12:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 13:
            {
                pzshape::TPZShapeQuad::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 14:
            case 15:
            case 16:
            case 17:
            {
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
            
            case 18:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << __PRETTY_FUNCTION__ << " Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
       
        
    }